

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O1

void __thiscall QSortFilterProxyModel::sort(QSortFilterProxyModel *this,int column,SortOrder order)

{
  QSortFilterProxyModelPrivate *this_00;
  parameter_type pVar1;
  
  this_00 = *(QSortFilterProxyModelPrivate **)(this + 8);
  pVar1 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
          ::value(&this_00->dynamic_sortfilter);
  if (((pVar1) && (this_00->proxy_sort_column == column)) && (this_00->sort_order == order)) {
    return;
  }
  this_00->sort_order = order;
  this_00->proxy_sort_column = column;
  QSortFilterProxyModelPrivate::update_source_sort_column(this_00);
  QSortFilterProxyModelPrivate::sort(this_00);
  return;
}

Assistant:

void QSortFilterProxyModel::sort(int column, Qt::SortOrder order)
{
    Q_D(QSortFilterProxyModel);
    if (d->dynamic_sortfilter && d->proxy_sort_column == column && d->sort_order == order)
        return;
    d->sort_order = order;
    d->proxy_sort_column = column;
    d->update_source_sort_column();
    d->sort();
}